

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsTTDGetSnapShotBoundInterval
          (JsRuntimeHandle runtimeHandle,int64_t targetEventTime,int64_t *startSnapTime,
          int64_t *endSnapTime)

{
  bool bVar1;
  JsrtRuntime *this;
  ThreadContext *this_00;
  ThreadContext *threadContext;
  JsrtRuntime *runtime;
  int64_t *endSnapTime_local;
  int64_t *startSnapTime_local;
  int64_t targetEventTime_local;
  JsRuntimeHandle runtimeHandle_local;
  
  this = JsrtRuntime::FromHandle(runtimeHandle);
  this_00 = JsrtRuntime::GetThreadContext(this);
  bVar1 = ThreadContext::IsRuntimeInTTDMode(this_00);
  if (!bVar1) {
    TTDAbort_unrecoverable_error("Should only happen in TT debugging mode.");
  }
  TTD::EventLog::GetSnapShotBoundInterval(this_00->TTDLog,targetEventTime,startSnapTime,endSnapTime)
  ;
  return JsNoError;
}

Assistant:

CHAKRA_API JsTTDGetSnapShotBoundInterval(_In_ JsRuntimeHandle runtimeHandle, _In_ int64_t targetEventTime, _Out_ int64_t* startSnapTime, _Out_ int64_t* endSnapTime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtRuntime* runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext* threadContext = runtime->GetThreadContext();
    TTDAssert(threadContext->IsRuntimeInTTDMode(), "Should only happen in TT debugging mode.");

#ifdef __APPLE__
    //TODO: Explicit cast of ptr since compiler gets confused -- resolve in PAL later
    static_assert(sizeof(int64_t) == sizeof(int64), "int64_t and int64 size mis-match");
    threadContext->TTDLog->GetSnapShotBoundInterval(targetEventTime, (int64*)startSnapTime, (int64*)endSnapTime);
#else
    threadContext->TTDLog->GetSnapShotBoundInterval(targetEventTime, startSnapTime, endSnapTime);
#endif

    return JsNoError;
#endif
}